

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_Leader::GetArrowHeadDirection(ON_OBSOLETE_V5_Leader *this,ON_2dVector *arrowhead_dir)

{
  bool bVar1;
  int iVar2;
  ON_2dPoint *this_00;
  ON_2dPoint *p;
  ON_2dVector OVar3;
  double local_38;
  double local_30;
  int local_24;
  int i;
  int point_count;
  bool rc;
  ON_2dVector *arrowhead_dir_local;
  ON_OBSOLETE_V5_Leader *this_local;
  
  iVar2 = ON_SimpleArray<ON_2dPoint>::Count
                    (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                      super_ON_SimpleArray<ON_2dPoint>);
  if (iVar2 < 2) {
    ON_2dVector::Set(arrowhead_dir,-1.0,0.0);
  }
  else {
    for (local_24 = 1; local_24 < iVar2; local_24 = local_24 + 1) {
      this_00 = ON_SimpleArray<ON_2dPoint>::operator[]
                          (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                            super_ON_SimpleArray<ON_2dPoint>,0);
      p = ON_SimpleArray<ON_2dPoint>::operator[]
                    (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                      super_ON_SimpleArray<ON_2dPoint>,local_24);
      OVar3 = ON_2dPoint::operator-(this_00,p);
      local_38 = OVar3.x;
      arrowhead_dir->x = local_38;
      local_30 = OVar3.y;
      arrowhead_dir->y = local_30;
      bVar1 = ON_2dVector::Unitize(arrowhead_dir);
      if (bVar1) {
        return true;
      }
      ON_2dVector::Set(arrowhead_dir,-1.0,0.0);
    }
  }
  return false;
}

Assistant:

bool ON_OBSOLETE_V5_Leader::GetArrowHeadDirection( ON_2dVector& arrowhead_dir ) const
{
  bool rc = false;
  const int point_count = m_points.Count();
  if ( point_count < 2 )
  {
    arrowhead_dir.Set(-1.0,0.0);
  }
  else
  {
    int i;
    for ( i = 1; i < point_count; i++ )
    {
      arrowhead_dir = m_points[0] -  m_points[i];
      if ( arrowhead_dir.Unitize() )
      {
        rc = true;
        break;
      }
      arrowhead_dir.Set(-1.0,0.0);
    }
  }
  return rc;
}